

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O0

void __thiscall
QGridLayout::addWidget
          (QGridLayout *this,QWidget *widget,int fromRow,int fromColumn,int rowSpan,int columnSpan,
          Alignment alignment)

{
  long lVar1;
  bool bVar2;
  QGridLayoutPrivate *pQVar3;
  int in_ECX;
  int in_EDX;
  QGridBox *in_RDI;
  int in_R8D;
  int in_R9D;
  long in_FS_OFFSET;
  int unaff_retaddr;
  int unaff_retaddr_00;
  int in_stack_00000008;
  int in_stack_0000000c;
  QGridBox *b;
  int toColumn;
  int toRow;
  QGridLayoutPrivate *d;
  QFlagsStorage<Qt::AlignmentFlag> in_stack_ffffffffffffff9c;
  int iVar4;
  int iVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QGridLayout *)0x335de9);
  bVar2 = QLayoutPrivate::checkWidget
                    ((QLayoutPrivate *)CONCAT44(in_EDX,in_ECX),(QWidget *)CONCAT44(in_R8D,in_R9D));
  if (bVar2) {
    if (in_R8D < 0) {
      iVar5 = -1;
    }
    else {
      iVar5 = in_EDX + in_R8D + -1;
    }
    if (in_R9D < 0) {
      iVar4 = -1;
    }
    else {
      iVar4 = in_ECX + in_R9D + -1;
    }
    QLayout::addChildWidget((QLayout *)CONCAT44(in_R8D,in_R9D),(QWidget *)pQVar3);
    pQVar3 = (QGridLayoutPrivate *)operator_new(0x18);
    QGridBox::QGridBox(in_RDI,(QLayout *)CONCAT44(iVar5,iVar4),(QWidget *)pQVar3);
    QGridBox::setAlignment((QGridBox *)0x335ea8,(Alignment)in_stack_ffffffffffffff9c.i);
    QGridLayoutPrivate::add
              (pQVar3,in_RDI,in_stack_0000000c,in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
    (*(code *)in_RDI->item_[7]._vptr_QLayoutItem)();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGridLayout::addWidget(QWidget *widget, int fromRow, int fromColumn,
                            int rowSpan, int columnSpan, Qt::Alignment alignment)
{
    Q_D(QGridLayout);
    if (!d->checkWidget(widget))
        return;
    int toRow = (rowSpan < 0) ? -1 : fromRow + rowSpan - 1;
    int toColumn = (columnSpan < 0) ? -1 : fromColumn + columnSpan - 1;
    addChildWidget(widget);
    QGridBox *b = new QGridBox(this, widget);
    b->setAlignment(alignment);
    d->add(b, fromRow, toRow, fromColumn, toColumn);
    invalidate();
}